

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

void __thiscall Clasp::ClaspFacade::Statistics::~Statistics(Statistics *this)

{
  long in_RDI;
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3> *unaff_retaddr;
  SolverStats *this_00;
  
  if (*(long **)(in_RDI + 0x90) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x90) + 8))();
  }
  this_00 = *(SolverStats **)(in_RDI + 0x48);
  if (this_00 != (SolverStats *)0x0) {
    SolverStats::~SolverStats(this_00);
    operator_delete(this_00);
  }
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>::~StatsVec(unaff_retaddr);
  StatsVec<Clasp::SolverStats,_(Potassco::Statistics_t::E)3>::~StatsVec(unaff_retaddr);
  SolverStats::~SolverStats(this_00);
  SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject>::~SingleOwnerPtr
            ((SingleOwnerPtr<Clasp::Asp::LpStats,_Clasp::DeleteObject> *)0x130fb0);
  return;
}

Assistant:

~Statistics() { delete clingo_; delete solvers_.multi; }